

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Axis.cpp
# Opt level: O0

Twist * __thiscall iDynTree::Axis::getTranslationTwist(Axis *this,double ddist)

{
  VectorFixSize<3U> *pVVar1;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *this_00;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *this_01;
  VectorFixSize<3U> *in_RSI;
  SpatialVector<iDynTree::SpatialMotionVector> *in_RDI;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> orig;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> dir;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> angVel;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> linVel;
  Twist *ret;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_stack_fffffffffffffe88;
  SpatialVector<iDynTree::SpatialMotionVector> *this_02;
  CommaInitializer<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *this_03;
  CommaInitializer<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_2a;
  
  this_02 = in_RDI;
  Twist::Twist((Twist *)0x62714f);
  pVVar1 = &SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(in_RDI)->super_Vector3;
  this_00 = (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *
            )VectorFixSize<3U>::data(pVVar1);
  this_03 = &local_2a;
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)this_02);
  Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_03,
             (PointerArgType)this_00,(Stride<0,_0> *)this_02);
  pVVar1 = &SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(in_RDI)->super_Vector3;
  VectorFixSize<3U>::data(pVVar1);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)this_02);
  Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_03,
             (PointerArgType)this_00,(Stride<0,_0> *)this_02);
  VectorFixSize<3U>::data(in_RSI);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)this_02);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_03,
             (PointerArgType)this_00,(Stride<0,_0> *)this_02);
  this_01 = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
             *)VectorFixSize<3U>::data(in_RSI + 1);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)this_02);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_03,
             (PointerArgType)this_00,(Stride<0,_0> *)this_02);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  operator*(this_01,in_RSI->m_data);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_02,
             in_stack_fffffffffffffe88);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  operator<<(this_00,(Scalar *)this_02);
  Eigen::
  CommaInitializer<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  operator_(this_03,(Scalar *)this_00);
  Eigen::
  CommaInitializer<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  operator_(this_03,(Scalar *)this_00);
  Eigen::
  CommaInitializer<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  ~CommaInitializer((CommaInitializer<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)0x627309);
  return (Twist *)this_02;
}

Assistant:

Twist Axis::getTranslationTwist(const double ddist) const
    {
        Twist ret;

        Eigen::Map<Eigen::Vector3d> linVel(ret.getLinearVec3().data());
        Eigen::Map<Eigen::Vector3d> angVel(ret.getAngularVec3().data());

        Eigen::Map<const Eigen::Vector3d> dir(direction.data());
        Eigen::Map<const Eigen::Vector3d> orig(origin.data());

        linVel = dir*ddist;
        angVel << 0,0,0;

        return ret;
    }